

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ResultInfo::getMessage_abi_cxx11_(string *__return_storage_ptr__,ResultInfo *this)

{
  ResultInfo *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_message);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultInfo::getMessage() const {
        return m_message;
    }